

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,ArrayPtr<const_char> *first,CappedArray<char,_26UL> *rest,
                 ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
                 FixedArray<char,_1UL> *rest_3)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar3 = first->ptr;
  sVar1 = first->size_;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    target[sVar2] = pcVar3[sVar2];
  }
  pcVar3 = fill<kj::CappedArray<char,26ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                     (target + sVar2,rest,rest_1,rest_2,rest_3);
  return pcVar3;
}

Assistant:

inline constexpr const T* end() const { return ptr + size_; }